

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O0

int __thiscall
CVmObjBigNum::getp_numType(CVmObjBigNum *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  int iVar1;
  vm_val_t *in_RDX;
  int32_t intval;
  long in_RDI;
  CVmNativeCodeDesc *in_stack_ffffffffffffff98;
  uint *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  uint uVar2;
  
  if ((getp_numType(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_numType(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_numType::desc,0);
    __cxa_guard_release(&getp_numType(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    ((vm_val_t *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                     in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  if (iVar1 == 0) {
    iVar1 = get_type(*(char **)(in_RDI + 8));
    if (iVar1 == 0) {
      iVar1 = is_zero(*(char **)(in_RDI + 8));
      if (iVar1 == 0) {
        uVar2 = 0;
      }
      else {
        iVar1 = get_neg(*(char **)(in_RDI + 8));
        uVar2 = 0x10;
        if (iVar1 != 0) {
          uVar2 = 0x20;
        }
      }
      vm_val_t::set_int(in_RDX,uVar2 | 1);
    }
    else if ((iVar1 == 2) || (iVar1 != 4)) {
      vm_val_t::set_int(in_RDX,2);
    }
    else {
      iVar1 = get_neg(*(char **)(in_RDI + 8));
      intval = 4;
      if (iVar1 != 0) {
        intval = 8;
      }
      vm_val_t::set_int(in_RDX,intval);
    }
  }
  return 1;
}

Assistant:

int CVmObjBigNum::getp_numType(VMG_ vm_obj_id_t self,
                               vm_val_t *retval, uint *argc)
{
    /* check arguments */
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* set the appropriate flags */
    switch (get_type(ext_))
    {
    case VMBN_T_NUM:
        retval->set_int(NumTypeNum
                        | (is_zero(ext_)
                           ? (get_neg(ext_) ? NumTypeNZero : NumTypePZero)
                           : 0));
        break;

    case VMBN_T_INF:
        retval->set_int(get_neg(ext_) ? NumTypeNInf : NumTypePInf);
        break;

    case VMBN_T_NAN:
    default:
        retval->set_int(NumTypeNAN);
        break;
    }

    /* handled */
    return TRUE;
}